

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

bool Imf_3_4::checkOpenEXRFile
               (char *data,size_t numBytes,bool reduceMemory,bool reduceTime,bool runCoreCheck)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint *puVar8;
  Header *pHVar9;
  ulong uVar10;
  bool reduceTime_00;
  bool reduceTime_01;
  bool reduceTime_02;
  undefined3 in_register_00000081;
  bool bVar11;
  bool bVar12;
  exr_context_t f;
  int maxTileHeight;
  int maxTileWidth;
  int maxImageHeight;
  int maxImageWidth;
  MultiPartInputFile multi;
  PtrIStream stream;
  exr_context_t local_118;
  size_t local_110;
  _priv_exr_context_t local_108;
  undefined7 uStack_107;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  undefined ***local_c8;
  code *pcStack_c0;
  code *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  long local_78;
  undefined **local_70;
  size_t local_68;
  char *local_48;
  char *local_40;
  char *local_38;
  
  if (CONCAT31(in_register_00000081,runCoreCheck) == 0) {
    Imf_3_4::IStream::IStream((IStream *)&local_70,"none");
    local_70 = &PTR__IStream_001295d8;
    local_38 = data + numBytes;
    local_48 = data;
    local_40 = data;
    local_78 = Imf_3_4::CompositeDeepScanLine::getMaximumSampleCount();
    Imf_3_4::Header::getMaxImageSize(&local_ec,&local_f0);
    Imf_3_4::Header::getMaxImageSize(&local_f4,&local_f8);
    iVar6 = 0x4000;
    if (reduceMemory || reduceTime) {
      Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(0x100000);
      iVar6 = 0x200;
      Imf_3_4::Header::setMaxImageSize(0x800,0x800);
    }
    Imf_3_4::Header::setMaxTileSize(iVar6,iVar6);
    local_118 = &local_108;
    local_110 = 0;
    local_108 = (_priv_exr_context_t)0x0;
    iVar6 = Imf_3_4::globalThreadCount();
    Imf_3_4::MultiPartInputFile::MultiPartInputFile
              ((MultiPartInputFile *)&local_e8,(IStream *)&local_70,iVar6,true);
    Imf_3_4::MultiPartInputFile::header((int)&local_e8);
    Imf_3_4::Header::type_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_118);
    cVar4 = Imf_3_4::isTiled((string *)&local_118);
    if (cVar4 == '\0') {
      bVar12 = false;
    }
    else {
      Imf_3_4::MultiPartInputFile::header((int)&local_e8);
      puVar8 = (uint *)Imf_3_4::Header::tileDescription();
      uVar1 = *puVar8;
      uVar2 = puVar8[1];
      pHVar9 = (Header *)Imf_3_4::MultiPartInputFile::header((int)&local_e8);
      iVar6 = Imf_3_4::calculateBytesPerPixel(pHVar9);
      if ((local_110 == DAT_0012aa60) &&
         ((local_110 == 0 || (iVar7 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110), iVar7 == 0))))
      {
        uVar10 = 4;
        if (4 < (ulong)(long)iVar6) {
          uVar10 = (long)iVar6;
        }
      }
      else {
        uVar10 = (long)iVar6;
      }
      bVar12 = 1000000 < (ulong)uVar2 * (ulong)uVar1 * uVar10;
    }
    bVar3 = anon_unknown_0::readMultiPart((MultiPartInputFile *)&local_e8,reduceMemory,reduceTime);
    if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
    }
    if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
    }
    if (!reduceMemory) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readRgba((RgbaInputFile *)&local_e8,reduceTime,reduceTime_00);
      Imf_3_4::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&local_e8);
      bVar11 = bVar3;
      if (((bVar5) && (bVar11 = true, local_110 == DAT_0012aa60)) &&
         (bVar11 = bVar3, local_110 != 0)) {
        iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
        bVar11 = true;
        if (iVar6 == 0) {
          bVar11 = bVar3;
        }
      }
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::InputFile::InputFile((InputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readScanline<Imf_3_4::InputFile>
                        ((InputFile *)&local_e8,reduceTime,reduceTime_01);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      bVar3 = bVar11;
      if (((bVar5) && (bVar3 = true, local_110 == DAT_0012aa60)) && (bVar3 = bVar11, local_110 != 0)
         ) {
        iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
        bVar3 = true;
        if (iVar6 == 0) {
          bVar3 = bVar11;
        }
      }
    }
    bVar11 = bVar3;
    if ((!reduceMemory) || (!bVar12)) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::TiledInputFile::TiledInputFile
                ((TiledInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar5 = anon_unknown_0::readTile<Imf_3_4::TiledInputFile>
                        ((TiledInputFile *)&local_e8,reduceMemory,reduceTime);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      if ((bVar5) && (local_110 == DAT_0012aa20)) {
        if (local_110 == 0) {
          bVar11 = true;
        }
        else {
          iVar6 = bcmp(local_118,TILEDIMAGE_abi_cxx11_,local_110);
          bVar11 = true;
          if (iVar6 != 0) {
            bVar11 = bVar3;
          }
        }
      }
    }
    bVar5 = bVar11;
    if (!reduceMemory) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::DeepScanLineInputFile::DeepScanLineInputFile
                ((DeepScanLineInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar3 = anon_unknown_0::readDeepScanLine<Imf_3_4::DeepScanLineInputFile>
                        ((DeepScanLineInputFile *)&local_e8,reduceTime,reduceTime_02);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      if ((bVar3) && (local_110 == DAT_0012aa40)) {
        if (local_110 == 0) {
          bVar5 = true;
        }
        else {
          iVar6 = bcmp(local_118,DEEPSCANLINE_abi_cxx11_,local_110);
          bVar5 = true;
          if (iVar6 != 0) {
            bVar5 = bVar11;
          }
        }
      }
    }
    bVar3 = bVar5;
    if ((!reduceMemory) || (!bVar12)) {
      (*(code *)local_70[6])(&local_70,0);
      iVar6 = Imf_3_4::globalThreadCount();
      Imf_3_4::DeepTiledInputFile::DeepTiledInputFile
                ((DeepTiledInputFile *)&local_e8,(IStream *)&local_70,iVar6);
      bVar12 = anon_unknown_0::readDeepTile<Imf_3_4::DeepTiledInputFile>
                         ((DeepTiledInputFile *)&local_e8,reduceMemory,reduceTime);
      if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
      }
      if (p_Stack_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_e0);
      }
      if ((bVar12) && (local_110 == DAT_0012aa60)) {
        if (local_110 == 0) {
          bVar3 = true;
        }
        else {
          iVar6 = bcmp(local_118,DEEPTILE_abi_cxx11_,local_110);
          bVar3 = true;
          if (iVar6 != 0) {
            bVar3 = bVar5;
          }
        }
      }
    }
    Imf_3_4::CompositeDeepScanLine::setMaximumSampleCount(local_78);
    Imf_3_4::Header::setMaxImageSize(local_ec,local_f0);
    Imf_3_4::Header::setMaxTileSize(local_f4,local_f8);
    if (local_118 != &local_108) {
      operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
    }
    Imf_3_4::IStream::~IStream((IStream *)&local_70);
  }
  else {
    local_98 = 0;
    local_a8 = 0;
    uStack_a0 = 0;
    uStack_b0 = 0;
    local_d8 = 0;
    p_Stack_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88 = 0;
    local_e8 = 0x68;
    uStack_90 = 0xbf800000fffffffe;
    local_c8 = &local_70;
    pcStack_c0 = anon_unknown_0::memstream_read;
    local_b8 = anon_unknown_0::memstream_size;
    p_Stack_e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 anon_unknown_0::core_error_handler_cb;
    if (reduceMemory || reduceTime) {
      uStack_a0 = 0x80000000800;
      local_98 = 0x20000000200;
    }
    local_70 = (undefined **)data;
    local_68 = numBytes;
    iVar6 = exr_start_read(&local_118,"<memstream>",&local_e8);
    bVar3 = true;
    if (iVar6 == 0) {
      bVar3 = anon_unknown_0::checkCoreFile(local_118,reduceMemory,reduceTime);
      exr_finish(&local_118);
    }
  }
  return bVar3;
}

Assistant:

bool
checkOpenEXRFile (
    const char* data,
    size_t      numBytes,
    bool        reduceMemory,
    bool        reduceTime,
    bool        runCoreCheck)
{

    if (runCoreCheck)
    {
        return runCoreChecks (data, numBytes, reduceMemory, reduceTime);
    }
    else
    {
        PtrIStream stream (data, numBytes);
        return runChecks (stream, reduceMemory, reduceTime);
    }
}